

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::add_suggest_piece(torrent *this,piece_index_t index)

{
  piece_index_t index_00;
  int iVar1;
  int max_queue_size;
  int *piVar2;
  pointer this_00;
  session_settings *this_01;
  int local_24;
  int availability;
  int local_1c;
  torrent *ptStack_18;
  int peers;
  torrent *this_local;
  piece_index_t index_local;
  
  ptStack_18 = this;
  this_local._4_4_ = index.m_val;
  need_picker(this);
  availability = num_peers(this);
  local_24 = 1;
  piVar2 = ::std::max<int>(&availability,&local_24);
  local_1c = *piVar2;
  this_00 = ::std::
            unique_ptr<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
            ::operator->(&(this->super_torrent_hot_members).m_picker);
  iVar1 = piece_picker::get_availability(this_00,this_local._4_4_);
  index_00.m_val = this_local._4_4_;
  iVar1 = (iVar1 * 100) / local_1c;
  this_01 = settings(this);
  max_queue_size = session_settings::get_int(this_01,0x4042);
  suggest_piece::add_piece(&this->m_suggest_pieces,index_00,iVar1,max_queue_size);
  return;
}

Assistant:

void torrent::add_suggest_piece(piece_index_t const index)
	{
		TORRENT_ASSERT(settings().get_int(settings_pack::suggest_mode)
			== settings_pack::suggest_read_cache);

		// when we care about suggest mode, we keep the piece picker
		// around to track piece availability
		need_picker();
		int const peers = std::max(num_peers(), 1);
		int const availability = m_picker->get_availability(index) * 100 / peers;

		m_suggest_pieces.add_piece(index, availability
			, settings().get_int(settings_pack::max_suggest_pieces));
	}